

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::debug(aalcalc *this,string *subfolder)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  string s;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  loadoccurrence(this);
  std::operator+(&path,"work/",subfolder);
  std::__cxx11::string::substr((ulong)&s,(ulong)&path);
  bVar1 = std::operator!=(&s,"/");
  std::__cxx11::string::~string((string *)&s);
  if (bVar1) {
    std::operator+(&s,&path,"/");
    std::__cxx11::string::operator=((string *)&path,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
  }
  __dirp = opendir(path._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      std::__cxx11::string::string((string *)&s,pdVar2->d_name,(allocator *)&local_50);
      if (4 < s._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&s);
        bVar1 = std::operator==(&local_50,".bin");
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) {
          std::operator+(&local_50,&path,pdVar2->d_name);
          std::__cxx11::string::operator=((string *)&s,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          debug_process_summaryfile(this,&s);
        }
      }
      std::__cxx11::string::~string((string *)&s);
    }
    std::__cxx11::string::~string((string *)&path);
    return;
  }
  fprintf(_stderr,"FATAL: Unable to open directory %s\n",path._M_dataplus._M_p);
  exit(-1);
}

Assistant:

void aalcalc::debug(const std::string &subfolder)
{
	loadoccurrence();
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				debug_process_summaryfile(s);
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}
}